

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_type_patterns
                 (lysc_ctx *ctx,lysp_restr *patterns_p,lysc_pattern **base_patterns,
                 lysc_pattern ***patterns)

{
  void **ppvVar1;
  lysc_pattern *plVar2;
  lysc_ext_instance *plVar3;
  lysp_ext_instance *plVar4;
  bool bVar5;
  LY_ERR ret__;
  LY_ERR LVar6;
  int iVar7;
  lysc_pattern **pplVar8;
  lysp_ext_instance *plVar9;
  undefined8 *puVar10;
  lysc_pattern *plVar11;
  long *plVar12;
  lysp_ext_instance *plVar13;
  lysp_restr *plVar14;
  long lVar15;
  void *pvVar16;
  lysp_ext_instance *plVar17;
  LY_ERR local_54;
  
  if (base_patterns != (lysc_pattern **)0x0) {
    pplVar8 = lysc_patterns_dup(ctx->ctx,base_patterns);
    *patterns = pplVar8;
    if (pplVar8 == (lysc_pattern **)0x0) {
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_type_patterns");
      return LY_EMEM;
    }
  }
  plVar17 = (lysp_ext_instance *)0x0;
  LVar6 = LY_SUCCESS;
  do {
    if (patterns_p == (lysp_restr *)0x0) {
      plVar9 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar9 = patterns_p[-1].exts;
    }
    if (plVar9 <= plVar17) {
      return LVar6;
    }
    pplVar8 = *patterns;
    if (pplVar8 == (lysc_pattern **)0x0) {
      puVar10 = (undefined8 *)malloc(0x10);
      if (puVar10 == (undefined8 *)0x0) goto LAB_001471b1;
      *puVar10 = 1;
LAB_001471a6:
      *patterns = (lysc_pattern **)(puVar10 + 1);
      bVar5 = true;
    }
    else {
      plVar2 = pplVar8[-1];
      pplVar8[-1] = (lysc_pattern *)((long)&plVar2->expr + 1);
      puVar10 = (undefined8 *)realloc(pplVar8 + -1,(long)plVar2 * 8 + 0x10);
      if (puVar10 != (undefined8 *)0x0) goto LAB_001471a6;
      (*patterns)[-1] = (lysc_pattern *)&(*patterns)[-1][-1].field_0x3f;
LAB_001471b1:
      bVar5 = false;
      local_54 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_type_patterns");
    }
    if (!bVar5) {
      return local_54;
    }
    pplVar8 = *patterns;
    plVar2 = pplVar8[-1];
    pplVar8[(long)&plVar2[-1].field_0x3f] = (lysc_pattern *)0x0;
    plVar11 = (lysc_pattern *)calloc(1,0x40);
    pplVar8[(long)&plVar2[-1].field_0x3f] = plVar11;
    *(int *)&plVar11->field_0x38 = *(int *)&plVar11->field_0x38 + 2;
    LVar6 = lys_compile_type_pattern_check
                      (ctx->ctx,patterns_p[(long)plVar17].arg.str + 1,
                       &pplVar8[(long)&plVar2[-1].field_0x3f]->code);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    plVar14 = patterns_p + (long)plVar17;
    if (*(plVar14->arg).str == '\x15') {
      *(uint *)&pplVar8[(long)&plVar2[-1].field_0x3f]->field_0x38 =
           *(uint *)&pplVar8[(long)&plVar2[-1].field_0x3f]->field_0x38 | 1;
    }
    LVar6 = lydict_insert(ctx->ctx,(plVar14->arg).str + 1,0,
                          &pplVar8[(long)&plVar2[-1].field_0x3f]->expr);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    LVar6 = lydict_dup(ctx->ctx,plVar14->eapptag,&pplVar8[(long)&plVar2[-1].field_0x3f]->eapptag);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    LVar6 = lydict_dup(ctx->ctx,plVar14->emsg,&pplVar8[(long)&plVar2[-1].field_0x3f]->emsg);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    LVar6 = lydict_dup(ctx->ctx,plVar14->dsc,&pplVar8[(long)&plVar2[-1].field_0x3f]->dsc);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    LVar6 = lydict_dup(ctx->ctx,plVar14->ref,&pplVar8[(long)&plVar2[-1].field_0x3f]->ref);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    plVar9 = plVar14->exts;
    if (plVar9 == (lysp_ext_instance *)0x0) {
      LVar6 = LY_SUCCESS;
    }
    else {
      plVar3 = pplVar8[(long)&plVar2[-1].field_0x3f]->exts;
      if (plVar3 == (lysc_ext_instance *)0x0) {
        pvVar16 = (void *)0x0;
        plVar12 = (long *)calloc(1,(long)plVar9[-1].exts * 0x48 + 8);
      }
      else {
        pvVar16 = plVar3[-1].compiled;
        plVar12 = (long *)realloc(&plVar3[-1].compiled,
                                  ((long)&(plVar9[-1].exts)->name +
                                  (long)plVar3[-1].compiled + (long)pvVar16) * 0x48 + 8);
      }
      if (plVar12 == (long *)0x0) {
        bVar5 = false;
        LVar6 = LY_EMEM;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_type_patterns");
        iVar7 = 5;
      }
      else {
        pplVar8[(long)&plVar2[-1].field_0x3f]->exts = (lysc_ext_instance *)(plVar12 + 1);
        bVar5 = true;
        if (pplVar8[(long)&plVar2[-1].field_0x3f]->exts != (lysc_ext_instance *)0x0) {
          if (plVar14->exts == (lysp_ext_instance *)0x0) {
            plVar9 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar9 = plVar14->exts[-1].exts;
          }
          memset(pplVar8[(long)&plVar2[-1].field_0x3f]->exts + *plVar12,0,
                 ((long)&plVar9->name + (long)pvVar16) * 0x48);
        }
        LVar6 = LY_SUCCESS;
        iVar7 = 0;
      }
      if (bVar5) {
        lVar15 = 0;
        plVar9 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar4 = plVar14->exts;
          if (plVar4 == (lysp_ext_instance *)0x0) {
            plVar13 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar13 = plVar4[-1].exts;
          }
          if (plVar13 <= plVar9) break;
          plVar11 = pplVar8[(long)&plVar2[-1].field_0x3f];
          plVar3 = plVar11->exts;
          pvVar16 = plVar3[-1].compiled;
          plVar3[-1].compiled = (void *)((long)pvVar16 + 1);
          LVar6 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar4->name + lVar15),
                                  plVar3 + (-(ulong)(plVar3 == (lysc_ext_instance *)0x0) |
                                           (ulong)pvVar16),plVar11);
          if (LVar6 != LY_SUCCESS) {
            if (LVar6 != LY_ENOT) {
              iVar7 = 5;
              goto LAB_00147485;
            }
            ppvVar1 = &pplVar8[(long)&plVar2[-1].field_0x3f]->exts[-1].compiled;
            *ppvVar1 = (void *)((long)*ppvVar1 + -1);
          }
          plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
          lVar15 = lVar15 + 0x70;
          LVar6 = LY_SUCCESS;
        }
        iVar7 = 0;
      }
LAB_00147485:
      if (iVar7 != 0) {
        if (iVar7 == 5) {
          local_54 = LVar6;
        }
        return local_54;
      }
    }
    plVar17 = (lysp_ext_instance *)((long)&plVar17->name + 1);
  } while( true );
}

Assistant:

LY_ERR
lys_compile_type_patterns(struct lysc_ctx *ctx, const struct lysp_restr *patterns_p, struct lysc_pattern **base_patterns,
        struct lysc_pattern ***patterns)
{
    struct lysc_pattern **pattern;
    LY_ARRAY_COUNT_TYPE u;
    LY_ERR ret = LY_SUCCESS;

    /* first, copy the patterns from the base type */
    if (base_patterns) {
        *patterns = lysc_patterns_dup(ctx->ctx, base_patterns);
        LY_CHECK_ERR_RET(!(*patterns), LOGMEM(ctx->ctx), LY_EMEM);
    }

    LY_ARRAY_FOR(patterns_p, u) {
        LY_ARRAY_NEW_RET(ctx->ctx, (*patterns), pattern, LY_EMEM);
        *pattern = calloc(1, sizeof **pattern);
        ++(*pattern)->refcount;

        ret = lys_compile_type_pattern_check(ctx->ctx, &patterns_p[u].arg.str[1], &(*pattern)->code);
        LY_CHECK_RET(ret);

        if (patterns_p[u].arg.str[0] == LYSP_RESTR_PATTERN_NACK) {
            (*pattern)->inverted = 1;
        }
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, &patterns_p[u].arg.str[1], 0, &(*pattern)->expr), done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].eapptag, (*pattern)->eapptag, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].emsg, (*pattern)->emsg, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].dsc, (*pattern)->dsc, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].ref, (*pattern)->ref, ret, done);
        COMPILE_EXTS_GOTO(ctx, patterns_p[u].exts, (*pattern)->exts, (*pattern), ret, done);
    }
done:
    return ret;
}